

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QRect __thiscall QListModeViewBase::mapToViewport(QListModeViewBase *this,QRect *rect)

{
  int iVar1;
  QRect QVar2;
  bool bVar3;
  Flow FVar4;
  int iVar5;
  int *piVar6;
  undefined8 *in_RSI;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  QRect result;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QRect *in_stack_ffffffffffffffa0;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x8844cf);
  if (bVar3) {
    local_18 = *in_RSI;
    local_10 = in_RSI[1];
  }
  else {
    local_18 = *in_RSI;
    local_10 = in_RSI[1];
    FVar4 = QCommonListViewBase::flow(in_RDI);
    if (FVar4 == TopToBottom) {
      QCommonListViewBase::spacing((QCommonListViewBase *)0x88453b);
      QRect::setLeft(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_1c = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                             );
      local_24 = QSize::width((QSize *)0x884563);
      QCommonListViewBase::viewport(in_RDI);
      local_28 = QWidget::width((QWidget *)0x884579);
      piVar6 = qMax<int>(&local_24,&local_28);
      iVar1 = *piVar6;
      iVar5 = QCommonListViewBase::spacing((QCommonListViewBase *)0x88459c);
      local_20 = iVar1 + iVar5 * -2;
      qMax<int>(&local_1c,&local_20);
      QRect::setWidth(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    else {
      QCommonListViewBase::spacing((QCommonListViewBase *)0x8845d4);
      QRect::setTop(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_2c = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
      local_34 = QSize::height((QSize *)0x8845fc);
      QCommonListViewBase::viewport(in_RDI);
      local_38 = QWidget::height((QWidget *)0x884612);
      piVar6 = qMax<int>(&local_34,&local_38);
      iVar1 = *piVar6;
      iVar5 = QCommonListViewBase::spacing((QCommonListViewBase *)0x884635);
      local_30 = iVar1 + iVar5 * -2;
      qMax<int>(&local_2c,&local_30);
      QRect::setHeight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (undefined4)local_10;
  QVar2.y2.m_i = local_10._4_4_;
  QVar2.x1.m_i = (undefined4)local_18;
  QVar2.y1.m_i = local_18._4_4_;
  return QVar2;
}

Assistant:

QRect QListModeViewBase::mapToViewport(const QRect &rect) const
{
    if (isWrapping())
        return rect;
    // If the listview is in "listbox-mode", the items are as wide as the view.
    // But we don't shrink the items.
    QRect result = rect;
    if (flow() == QListView::TopToBottom) {
        result.setLeft(spacing());
        result.setWidth(qMax(rect.width(), qMax(contentsSize.width(), viewport()->width()) - 2 * spacing()));
    } else { // LeftToRight
        result.setTop(spacing());
        result.setHeight(qMax(rect.height(), qMax(contentsSize.height(), viewport()->height()) - 2 * spacing()));
    }
    return result;
}